

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_consolebuffer.cpp
# Opt level: O0

void __thiscall FConsoleBuffer::FormatText(FConsoleBuffer *this,FFont *formatfont,int displaywidth)

{
  FFont *font;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  FBrokenLines **ppFVar4;
  uint *puVar5;
  FString *str;
  uint local_38;
  uint local_34;
  FBrokenLines *local_30;
  FBrokenLines *bl;
  uint i;
  uint brokensize;
  FFont *pFStack_18;
  int displaywidth_local;
  FFont *formatfont_local;
  FConsoleBuffer *this_local;
  
  brokensize = displaywidth;
  pFStack_18 = formatfont;
  formatfont_local = (FFont *)this;
  if (((formatfont != this->mLastFont) || (displaywidth != this->mLastDisplayWidth)) ||
     ((this->mBufferWasCleared & 1U) != 0)) {
    FreeBrokenText(this,0,0x7fffffff);
    TArray<FBrokenLines_*,_FBrokenLines_*>::Clear(&this->mBrokenConsoleText);
    TArray<unsigned_int,_unsigned_int>::Clear(&this->mBrokenStart);
    i = 0;
    TArray<unsigned_int,_unsigned_int>::Push(&this->mBrokenStart,&i);
    TArray<FBrokenLines_*,_FBrokenLines_*>::Clear(&this->mBrokenLines);
    this->mLastFont = pFStack_18;
    this->mLastDisplayWidth = brokensize;
    this->mBufferWasCleared = false;
  }
  uVar1 = TArray<FBrokenLines_*,_FBrokenLines_*>::Size(&this->mBrokenConsoleText);
  bl._4_4_ = uVar1;
  uVar2 = TArray<FString,_FString>::Size(&this->mConsoleText);
  if ((uVar1 == uVar2) && ((this->mLastLineNeedsUpdate & 1U) != 0)) {
    bl._4_4_ = bl._4_4_ - 1;
    ppFVar4 = TArray<FBrokenLines_*,_FBrokenLines_*>::operator[]
                        (&this->mBrokenConsoleText,(ulong)bl._4_4_);
    V_FreeBrokenLines(*ppFVar4);
    TArray<FBrokenLines_*,_FBrokenLines_*>::Resize(&this->mBrokenConsoleText,bl._4_4_);
  }
  puVar5 = TArray<unsigned_int,_unsigned_int>::operator[](&this->mBrokenStart,(ulong)bl._4_4_);
  TArray<FBrokenLines_*,_FBrokenLines_*>::Resize(&this->mBrokenLines,*puVar5);
  TArray<unsigned_int,_unsigned_int>::Resize(&this->mBrokenStart,bl._4_4_);
  for (bl._0_4_ = bl._4_4_; uVar1 = (uint)bl,
      uVar3 = TArray<FString,_FString>::Size(&this->mConsoleText), font = pFStack_18,
      uVar2 = brokensize, uVar1 < uVar3; bl._0_4_ = (uint)bl + 1) {
    str = TArray<FString,_FString>::operator[](&this->mConsoleText,(ulong)(uint)bl);
    local_30 = V_BreakLines(font,uVar2,str,true);
    TArray<FBrokenLines_*,_FBrokenLines_*>::Push(&this->mBrokenConsoleText,&local_30);
    local_34 = TArray<FBrokenLines_*,_FBrokenLines_*>::Size(&this->mBrokenLines);
    TArray<unsigned_int,_unsigned_int>::Push(&this->mBrokenStart,&local_34);
    for (; local_30->Width != -1; local_30 = local_30 + 1) {
      TArray<FBrokenLines_*,_FBrokenLines_*>::Push(&this->mBrokenLines,&local_30);
    }
  }
  uVar1 = TArray<FBrokenLines_*,_FBrokenLines_*>::Size(&this->mBrokenLines);
  this->mTextLines = uVar1;
  local_38 = this->mTextLines;
  TArray<unsigned_int,_unsigned_int>::Push(&this->mBrokenStart,&local_38);
  this->mLastLineNeedsUpdate = false;
  return;
}

Assistant:

void FConsoleBuffer::FormatText(FFont *formatfont, int displaywidth)
{
	if (formatfont != mLastFont || displaywidth != mLastDisplayWidth || mBufferWasCleared)
	{
		FreeBrokenText();
		mBrokenConsoleText.Clear();
		mBrokenStart.Clear();
		mBrokenStart.Push(0);
		mBrokenLines.Clear();
		mLastFont = formatfont;
		mLastDisplayWidth = displaywidth;
		mBufferWasCleared = false;
	}
	unsigned brokensize = mBrokenConsoleText.Size();
	if (brokensize == mConsoleText.Size())
	{
		// The last line got text appended. We have to wait until here to format it because
		// it is possible that during display new text will be added from the NetUpdate calls in the software version of DrawTextureV.
		if (mLastLineNeedsUpdate)
		{
			brokensize--;
			V_FreeBrokenLines(mBrokenConsoleText[brokensize]);
			mBrokenConsoleText.Resize(brokensize);
		}
	}
	mBrokenLines.Resize(mBrokenStart[brokensize]);
	mBrokenStart.Resize(brokensize);
	for (unsigned i = brokensize; i < mConsoleText.Size(); i++)
	{
		FBrokenLines *bl = V_BreakLines(formatfont, displaywidth, mConsoleText[i], true);
		mBrokenConsoleText.Push(bl);
		mBrokenStart.Push(mBrokenLines.Size());
		while (bl->Width != -1)
		{
			mBrokenLines.Push(bl);
			bl++;
		}
	}
	mTextLines = mBrokenLines.Size();
	mBrokenStart.Push(mTextLines);
	mLastLineNeedsUpdate = false;
}